

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  aom_codec_err_t aVar5;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_e8;
  int local_e0;
  uint local_dc;
  int local_d8;
  uint local_d4;
  int local_d0;
  uint local_cc;
  int local_c8;
  int local_c4;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_68;
  int local_58;
  int local_54;
  undefined8 local_4c;
  int local_44;
  undefined1 local_40;
  undefined8 local_3c;
  undefined8 local_34;
  undefined4 local_28;
  undefined8 local_20;
  
  aVar5 = AOM_CODEC_INCAPABLE;
  if ((ctx->ppi->cpi->oxcf).algo_cfg.skip_postproc_filtering == false) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar3 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar3 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar3 + 1;
    }
    piVar2 = (int *)*puVar3;
    if (piVar2 == (int *)0x0) {
      aVar5 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      local_c0 = *(ulong *)(piVar2 + 0x12);
      local_b8 = *(ulong *)(piVar2 + 0x14);
      local_b0 = *(ulong *)(piVar2 + 0x16);
      local_d8 = piVar2[0xc];
      local_d0 = piVar2[0xd];
      local_34 = *(undefined8 *)(piVar2 + 0xe);
      local_e8.field_0.y_width = piVar2[9];
      local_e0 = piVar2[10];
      local_58 = piVar2[0x10];
      local_e8.field_0.uv_width =
           (uint)(local_58 + local_e8.field_0.y_width) >> ((byte)local_58 & 0x1f);
      local_54 = piVar2[0x11];
      local_dc = (uint)(local_e0 + local_54) >> ((byte)local_54 & 0x1f);
      local_d4 = (uint)(local_d8 + local_58) >> ((byte)local_58 & 0x1f);
      local_cc = (uint)(local_d0 + local_54) >> ((byte)local_54 & 0x1f);
      local_c8 = piVar2[0x18];
      local_c4 = piVar2[0x19];
      local_4c = *(undefined8 *)(piVar2 + 3);
      local_44 = piVar2[5];
      local_40 = (undefined1)piVar2[6];
      local_3c = *(undefined8 *)(piVar2 + 7);
      aVar5 = AOM_CODEC_OK;
      if ((*(byte *)((long)piVar2 + 9) & 8) == 0) {
        local_28 = 0;
      }
      else {
        local_c0 = local_c0 >> 1;
        local_b8 = local_b8 >> 1;
        local_b0 = local_b0 >> 1;
        local_c8 = local_c8 >> 1;
        local_c4 = local_c4 >> 1;
        local_28 = 8;
      }
      iVar4 = local_c8 - (local_e8.field_0.y_width + 0x1fU & 0xffffffe0);
      local_68 = iVar4 / 2;
      if (iVar4 / 2 < 1) {
        local_68 = 0;
      }
      local_20 = *(undefined8 *)(piVar2 + 0x28);
      av1_copy_reference_enc(ctx->ppi->cpi,*piVar2,(YV12_BUFFER_CONFIG *)&local_e8.field_0);
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  if (ctx->ppi->cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return AOM_CODEC_INCAPABLE;
  av1_ref_frame_t *const frame = va_arg(args, av1_ref_frame_t *);

  if (frame != NULL) {
    YV12_BUFFER_CONFIG sd;

    image2yuvconfig(&frame->img, &sd);
    av1_copy_reference_enc(ctx->ppi->cpi, frame->idx, &sd);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}